

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O2

int SHA256_Final(uchar *md,SHA256_CTX *c)

{
  uint *data;
  undefined4 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int j;
  long in_RAX;
  uint uVar4;
  
  if (c != (SHA256_CTX *)0x0) {
    if (md != (uchar *)0x0) {
      uVar2._0_4_ = c->Nl;
      uVar2._4_4_ = c->Nh;
      data = c->data;
      uVar4 = (uint)(undefined4)uVar2 >> 3 & 0x3f;
      uVar2 = swap_bytes(uVar2);
      c->Nl = (int)uVar2;
      c->Nh = (int)((ulong)uVar2 >> 0x20);
      if (uVar4 == 0) {
        data[0] = 0;
        data[1] = 0;
        c->data[2] = 0;
        c->data[3] = 0;
        c->data[4] = 0;
        c->data[5] = 0;
        c->data[6] = 0;
        c->data[7] = 0;
        c->data[6] = 0;
        c->data[7] = 0;
        c->data[8] = 0;
        c->data[9] = 0;
        c->data[10] = 0;
        c->data[0xb] = 0;
        c->data[0xc] = 0;
        c->data[0xd] = 0;
        *(undefined1 *)data = 0x80;
      }
      else {
        *(undefined1 *)((long)data + (ulong)uVar4) = 0x80;
        if (uVar4 < 0x38) {
          memset((void *)((ulong)(uVar4 + 1) + (long)data),0,(ulong)(0x37 - uVar4));
        }
        else {
          if (uVar4 != 0x3f) {
            memset((void *)((ulong)(uVar4 + 1) + (long)data),0,(ulong)(uVar4 ^ 0x3f));
          }
          SHA256_Transform(c,(uchar *)data);
          c->data[6] = 0;
          c->data[7] = 0;
          c->data[8] = 0;
          c->data[9] = 0;
          c->data[10] = 0;
          c->data[0xb] = 0;
          c->data[0xc] = 0;
          c->data[0xd] = 0;
          data[0] = 0;
          data[1] = 0;
          c->data[2] = 0;
          c->data[3] = 0;
          c->data[4] = 0;
          c->data[5] = 0;
          c->data[6] = 0;
          c->data[7] = 0;
        }
      }
      uVar4 = c->Nh;
      c->data[0xe] = c->Nl;
      c->data[0xf] = uVar4;
      SHA256_Transform(c,(uchar *)data);
      for (in_RAX = 0; in_RAX != 8; in_RAX = in_RAX + 1) {
        uVar3 = c->h[in_RAX];
        uVar4 = swap_bytes(uVar3);
        c->h[in_RAX] = uVar4;
        uVar1 = swap_bytes(uVar3);
        *(undefined4 *)(md + in_RAX * 4) = uVar1;
      }
    }
    c->data[0] = 0;
    c->data[1] = 0;
    c->data[2] = 0;
    c->data[3] = 0;
    c->data[4] = 0;
    c->data[5] = 0;
    c->data[6] = 0;
    c->data[7] = 0;
    c->data[8] = 0;
    c->data[9] = 0;
    c->data[10] = 0;
    c->data[0xb] = 0;
    c->data[0xc] = 0;
    c->data[0xd] = 0;
    c->data[0xe] = 0;
    c->data[0xf] = 0;
    c->h[0] = 0;
    c->h[1] = 0;
    c->h[2] = 0;
    c->h[3] = 0;
    c->h[4] = 0;
    c->h[5] = 0;
    c->h[6] = 0;
    c->h[7] = 0;
    c->Nl = 0;
    c->Nh = 0;
    c->data[0] = 0;
    c->data[1] = 0;
    c->data[2] = 0;
    c->data[3] = 0;
    c->data[4] = 0;
    c->data[5] = 0;
    return (int)in_RAX;
  }
  __assert_fail("context != (SHA256_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x236,"void SHA256_Final(sha2_byte *, SHA256_CTX *)");
}

Assistant:

void SHA256_Final(sha2_byte digest[SHA256_DIGEST_LENGTH], SHA256_CTX* context) {
	sha2_word32	*d = (sha2_word32*)digest;
	unsigned int	usedspace;

	/* Sanity check: */
	assert(context != (SHA256_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		REVERSE64(context->bitcount,context->bitcount);
#endif
		if (usedspace > 0) {
			/* Begin padding with a 1 bit: */
			context->buffer[usedspace++] = 0x80;

			if (usedspace <= SHA256_SHORT_BLOCK_LENGTH) {
				/* Set-up for the last transform: */
				MEMSET_BZERO(&context->buffer[usedspace], SHA256_SHORT_BLOCK_LENGTH - usedspace);
			} else {
				if (usedspace < SHA256_BLOCK_LENGTH) {
					MEMSET_BZERO(&context->buffer[usedspace], SHA256_BLOCK_LENGTH - usedspace);
				}
				/* Do second-to-last transform: */
				SHA256_Transform(context, (sha2_word32*)context->buffer);

				/* And set-up for the last transform: */
				MEMSET_BZERO(context->buffer, SHA256_SHORT_BLOCK_LENGTH);
			}
		} else {
			/* Set-up for the last transform: */
			MEMSET_BZERO(context->buffer, SHA256_SHORT_BLOCK_LENGTH);

			/* Begin padding with a 1 bit: */
			*context->buffer = 0x80;
		}
		/* Set the bit count: */
        sha2_word64* ptr = (sha2_word64*)(&context->buffer[SHA256_SHORT_BLOCK_LENGTH]);
        *ptr = context->bitcount;

		/* Final transform: */
		SHA256_Transform(context, (sha2_word32*)context->buffer);

#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < 8; j++) {
				REVERSE32(context->state[j],context->state[j]);
				*d++ = context->state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->state, SHA256_DIGEST_LENGTH);
#endif
	}

	/* Clean up state data: */
	MEMSET_BZERO(context, sizeof(SHA256_CTX));
}